

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::GetVertexAttribTest::checkVertexAttribLdv<2u>
          (GetVertexAttribTest *this,GLuint index,bool *result)

{
  GLenum err;
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  char *local_1e8 [4];
  vertexAttribute<2U> vertex_attribute;
  stringstream function_name;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&function_name);
  poVar1 = std::operator<<(&local_1a8,"VertexAttribL");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"dv");
  iVar2 = 0x80;
  do {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) goto LAB_00a818a8;
    vertexAttribute<2U>::vertexAttribute(&vertex_attribute,this->m_min,this->m_max);
    (*(this->super_Base).gl.vertexAttribL2dv)(index,vertex_attribute.m_array);
    err = (*(this->super_Base).gl.getError)();
    std::__cxx11::stringbuf::str();
    glu::checkError(err,local_1e8[0],
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x31b);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::stringbuf::str();
    bVar3 = verifyResults(this,vertex_attribute.m_array,2,index,local_1e8[0],0x31d);
    std::__cxx11::string::~string((string *)local_1e8);
  } while (bVar3);
  *result = false;
LAB_00a818a8:
  std::__cxx11::stringstream::~stringstream((stringstream *)&function_name);
  return;
}

Assistant:

void GetVertexAttribTest::checkVertexAttribLdv(GLuint index, bool& result) const
{
	std::stringstream function_name;

	function_name << "VertexAttribL" << SIZE << "dv";

	for (GLuint i = 0; i < m_n_iterations; ++i)
	{
		vertexAttribute<SIZE> vertex_attribute(m_min, m_max);

		vertexAttribLdv<SIZE>(index, vertex_attribute);
		GLU_EXPECT_NO_ERROR(gl.getError(), function_name.str().c_str());

		if (false == verifyResults(vertex_attribute.m_array, SIZE, index, function_name.str().c_str(), __LINE__))
		{
			result = false;
			return;
		}
	}
}